

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

int __thiscall RegexTree::block_len(RegexTree *this,char *start)

{
  char cVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 1;
  lVar2 = 0;
  while( true ) {
    cVar1 = start[lVar2];
    if (cVar1 == '\0') {
      return -1;
    }
    iVar3 = (iVar3 + (uint)(cVar1 == '(')) - (uint)(cVar1 == ')');
    if (iVar3 == 0) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2 + 1;
}

Assistant:

int RegexTree::block_len(const char *start) {
    int stack = 1;
    for (int i = 0; start[i] != '\0'; i++) {
        if (start[i] == '(') ++stack;
        if (start[i] == ')') --stack;
        if (stack == 0) return i + 1;
    }
    return -1;
}